

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O2

dgVector __thiscall dgMatrix::CalcPitchYawRoll(dgMatrix *this)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  HaF32 x;
  undefined1 auVar8 [64];
  dgTemplateVector<float> local_18;
  undefined1 extraout_var [60];
  
  fVar6 = (this->m_front).super_dgTemplateVector<float>.m_z;
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar5 = vxorps_avx512vl(ZEXT416((uint)fVar6),auVar5);
  uVar1 = vcmpss_avx512f(SUB6416(ZEXT464(0x3f7fffef),0),ZEXT416((uint)fVar6),1);
  bVar2 = (bool)((byte)uVar1 & 1);
  uVar1 = vcmpss_avx512f(ZEXT416((uint)fVar6),SUB6416(ZEXT464(0xbf7fffef),0),1);
  bVar3 = (bool)((byte)uVar1 & 1);
  fVar6 = asinf((float)((uint)bVar3 * 0x3f7fffef +
                       (uint)!bVar3 * ((uint)bVar2 * -0x40800011 + (uint)!bVar2 * auVar5._0_4_)));
  if (0x7f7fffff < (uint)ABS(fVar6)) {
    __assert_fail("(isfinite(yaw) && !isnan(yaw))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMatrix.cpp"
                  ,0x110,"dgVector dgMatrix::CalcPitchYawRoll() const");
  }
  fVar7 = (this->m_front).super_dgTemplateVector<float>.m_z;
  if (0.99995 <= fVar7) {
    auVar8._0_4_ = atan2f((this->m_up).super_dgTemplateVector<float>.m_x,
                          (this->m_up).super_dgTemplateVector<float>.m_y);
    auVar8._4_60_ = extraout_var;
    auVar4._8_4_ = 0x80000000;
    auVar4._0_8_ = 0x8000000080000000;
    auVar4._12_4_ = 0x80000000;
    auVar5 = vxorps_avx512vl(auVar8._0_16_,auVar4);
    x = auVar5._0_4_;
  }
  else {
    if (-0.99995 < fVar7) {
      fVar7 = atan2f((this->m_front).super_dgTemplateVector<float>.m_y,
                     (this->m_front).super_dgTemplateVector<float>.m_x);
      x = (HaF32)atan2f((this->m_up).super_dgTemplateVector<float>.m_z,
                        (this->m_right).super_dgTemplateVector<float>.m_z);
      goto LAB_00d9f1c6;
    }
    x = (HaF32)atan2f((this->m_up).super_dgTemplateVector<float>.m_x,
                      (this->m_up).super_dgTemplateVector<float>.m_y);
  }
  fVar7 = 0.0;
LAB_00d9f1c6:
  dgVector::dgVector((dgVector *)&local_18,x,(HaF32)fVar6,(HaF32)fVar7,0.0);
  return (dgVector)local_18;
}

Assistant:

dgVector dgMatrix::CalcPitchYawRoll () const
{
	const hacd::HaF32 minSin = hacd::HaF32(0.99995f);

	const dgMatrix& matrix = *this;

	hacd::HaF32 roll = hacd::HaF32(0.0f);
	hacd::HaF32 pitch  = hacd::HaF32(0.0f);
	hacd::HaF32 yaw = dgAsin (-ClampValue (matrix[0][2], hacd::HaF32(-0.999999f), hacd::HaF32(0.999999f)));

	HACD_ASSERT (dgCheckFloat (yaw));
	if (matrix[0][2] < minSin) {
		if (matrix[0][2] > (-minSin)) {
			roll = dgAtan2 (matrix[0][1], matrix[0][0]);
			pitch = dgAtan2 (matrix[1][2], matrix[2][2]);
		} else {
			pitch = dgAtan2 (matrix[1][0], matrix[1][1]);
		}
	} else {
		pitch = -dgAtan2 (matrix[1][0], matrix[1][1]);
	}

#ifdef _DEBUG
	dgMatrix m (dgPitchMatrix (pitch) * dgYawMatrix(yaw) * dgRollMatrix(roll));
	for (hacd::HaI32 i = 0; i < 3; i ++) {
		for (hacd::HaI32 j = 0; j < 3; j ++) {
			hacd::HaF32 error = dgAbsf (m[i][j] - matrix[i][j]);
			HACD_ASSERT (error < 5.0e-2f);
		}
	}
#endif

	return dgVector (pitch, yaw, roll, hacd::HaF32(0.0f));
}